

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondR.cpp
# Opt level: O0

void __thiscall OpenMD::HBondR::writeDensityR(HBondR *this)

{
  SimInfo *pSVar1;
  double dVar2;
  byte bVar3;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  undefined8 uVar11;
  StaticAnalyser *in_RDI;
  RealType Rval;
  uint i;
  ofstream qRstream;
  uint local_218;
  ostream local_208 [520];
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar4,_S_out);
  bVar3 = std::ofstream::is_open();
  if ((bVar3 & 1) == 0) {
    uVar11 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"HBondR: unable to open %s\n",uVar11);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<(local_208,"# ");
    psVar6 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(local_208,"#selection 1: (");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[1].info_);
    std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(local_208,"#selection 2: (");
    poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 9));
    std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(local_208,"#selection 3: (");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &in_RDI[0x10].outputTypes_.
                                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar5,")\n");
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<(local_208,"# parameters: ");
      poVar5 = std::operator<<(poVar5,(string *)&in_RDI->paramString_);
      std::operator<<(poVar5,"\n");
    }
    poVar5 = std::operator<<(local_208,"#distance");
    std::operator<<(poVar5,"\tH Bonds\n");
    for (local_218 = 0;
        sVar8 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)
                           &in_RDI[0x19].dumpFilename_.field_2), local_218 < sVar8;
        local_218 = local_218 + 1) {
      pSVar1 = in_RDI[0x19].info_;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[0x19].outputFilename_,
                          (ulong)local_218);
      if (*pvVar9 != 0) {
        poVar5 = (ostream *)
                 std::ostream::operator<<(local_208,((double)local_218 + 0.5) * (double)pSVar1);
        poVar5 = std::operator<<(poVar5,"\t");
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[0x19].dumpFilename_.field_2,(ulong)local_218);
        dVar2 = *pvVar10;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&in_RDI[0x19].outputFilename_,
                            (ulong)local_218);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar2 / (double)*pvVar9);
        std::operator<<(poVar5,"\n");
      }
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void HBondR::writeDensityR() {
    // compute average box length:

    std::ofstream qRstream(outputFilename_.c_str());
    if (qRstream.is_open()) {
      qRstream << "# " << getAnalysisType() << "\n";
      qRstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qRstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qRstream << "#selection 3: (" << selectionScript3_ << ")\n";
      if (!paramString_.empty())
        qRstream << "# parameters: " << paramString_ << "\n";

      qRstream << "#distance"
               << "\tH Bonds\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        if (sliceCount_[i] != 0) {
          qRstream << Rval << "\t" << sliceQ_[i] / (RealType)sliceCount_[i]
                   << "\n";
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qRstream.close();
  }